

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXExportProperty::DumpAscii(FBXExportProperty *this,ostream *s,int indent)

{
  char cVar1;
  double *pdVar2;
  ulong uVar3;
  pointer puVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  ostringstream err;
  ostringstream local_1c8 [376];
  string local_50 [32];
  
  pdVar2 = (double *)
           (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
  cVar1 = this->type;
  uVar10 = uVar7;
  switch(cVar1) {
  case 'C':
    if (*(char *)pdVar2 == '\0') {
      local_1c8[0] = (ostringstream)0x46;
    }
    else {
      local_1c8[0] = (ostringstream)0x54;
    }
    goto LAB_0033e131;
  case 'D':
    dVar12 = *pdVar2;
    break;
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
    goto switchD_0033da9d_caseD_45;
  case 'F':
    dVar12 = (double)*(float *)pdVar2;
    break;
  case 'I':
    std::ostream::operator<<(s,(int)*(float *)pdVar2);
    return;
  case 'L':
    std::ostream::_M_insert<long>((long)s);
    return;
  case 'S':
    if (uVar7 == 0) {
      uVar10 = 0;
    }
    else {
      uVar3 = 0;
      do {
        uVar10 = uVar3;
        if (*(char *)((long)pdVar2 + uVar3) == '\0') break;
        uVar3 = uVar3 + 1;
        uVar10 = uVar7;
      } while (uVar7 != uVar3);
    }
  case 'R':
    local_1c8[0] = (ostringstream)0x22;
    std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
    puVar4 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
    if (uVar7 != 0) {
      lVar9 = 0;
      do {
        if (puVar4[lVar9] == '\"') {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"can\'t handle quotes in property string");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar9 = lVar9 + 1;
      } while (uVar7 + (uVar7 == 0) != lVar9);
    }
    uVar3 = uVar10 + 2;
    if (uVar3 < uVar7) {
      do {
        local_1c8[0] = *(ostringstream *)(puVar4 + uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
        uVar3 = uVar3 + 1;
        puVar4 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
      } while (uVar3 < uVar7);
    }
    if (uVar10 != uVar7) {
      std::__ostream_insert<char,std::char_traits<char>>(s,"::",2);
    }
    if (uVar10 != 0) {
      uVar7 = 0;
      do {
        local_1c8[0] = *(ostringstream *)
                        ((this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar7);
        std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    local_1c8[0] = (ostringstream)0x22;
LAB_0033e131:
    pcVar8 = (char *)local_1c8;
    lVar9 = 1;
LAB_0033e136:
    std::__ostream_insert<char,std::char_traits<char>>(s,pcVar8,lVar9);
    return;
  default:
    switch(cVar1) {
    case 'd':
      local_1c8[0] = (ostringstream)0x2a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
      if (-1 < indent) {
        iVar11 = indent + 1;
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,"a: ",3);
      *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = 0xf;
      if (7 < uVar7) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (lVar9 != 0) {
            local_1c8[0] = (ostringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          }
          if (uVar10 < 0x79) {
            uVar10 = uVar10 + 1;
          }
          else {
            local_1c8[0] = (ostringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
            uVar10 = 0;
          }
          std::ostream::_M_insert<double>(pdVar2[lVar9]);
          lVar9 = lVar9 + 1;
        } while ((uVar7 >> 3) + (ulong)(uVar7 >> 3 == 0) != lVar9);
      }
      local_1c8[0] = (ostringstream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      if (0 < indent) {
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          indent = indent + -1;
        } while (indent != 0);
      }
      break;
    case 'f':
      local_1c8[0] = (ostringstream)0x2a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
      if (-1 < indent) {
        iVar11 = indent + 1;
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,"a: ",3);
      if (3 < uVar7) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (lVar9 != 0) {
            local_1c8[0] = (ostringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          }
          if (uVar10 < 0x79) {
            uVar10 = uVar10 + 1;
          }
          else {
            local_1c8[0] = (ostringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
            uVar10 = 0;
          }
          std::ostream::_M_insert<double>((double)*(float *)((long)pdVar2 + lVar9 * 4));
          lVar9 = lVar9 + 1;
        } while ((uVar7 >> 2) + (ulong)(uVar7 >> 2 == 0) != lVar9);
      }
      local_1c8[0] = (ostringstream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      if (0 < indent) {
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          indent = indent + -1;
        } while (indent != 0);
      }
      break;
    case 'i':
      local_1c8[0] = (ostringstream)0x2a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
      if (-1 < indent) {
        iVar11 = indent + 1;
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,"a: ",3);
      if (3 < uVar7) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (lVar9 != 0) {
            local_1c8[0] = (ostringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          }
          if (uVar10 < 0x79) {
            uVar10 = uVar10 + 1;
          }
          else {
            local_1c8[0] = (ostringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
            uVar10 = 0;
          }
          std::ostream::operator<<(s,(int)*(float *)((long)pdVar2 + lVar9 * 4));
          lVar9 = lVar9 + 1;
        } while ((uVar7 >> 2) + (ulong)(uVar7 >> 2 == 0) != lVar9);
      }
      local_1c8[0] = (ostringstream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      if (0 < indent) {
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          indent = indent + -1;
        } while (indent != 0);
      }
      break;
    case 'l':
      local_1c8[0] = (ostringstream)0x2a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," {\n",3);
      if (-1 < indent) {
        iVar11 = indent + 1;
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(s,"a: ",3);
      if (7 < uVar7) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (lVar9 != 0) {
            local_1c8[0] = (ostringstream)0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          }
          if (uVar10 < 0x79) {
            uVar10 = uVar10 + 1;
          }
          else {
            local_1c8[0] = (ostringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
            uVar10 = 0;
          }
          std::ostream::_M_insert<long>((long)s);
          lVar9 = lVar9 + 1;
        } while ((uVar7 >> 3) + (ulong)(uVar7 >> 3 == 0) != lVar9);
      }
      local_1c8[0] = (ostringstream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
      if (0 < indent) {
        do {
          local_1c8[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>(s,(char *)local_1c8,1);
          indent = indent + -1;
        } while (indent != 0);
      }
      break;
    default:
      if (cVar1 == 'Y') {
        std::ostream::operator<<(s,*(short *)pdVar2);
        return;
      }
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
switchD_0033da9d_caseD_45:
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Tried to dump property with invalid type \'",0x2a);
      local_50[0] = (string)this->type;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,(char *)local_50,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'!",2);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,local_50);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar8 = "} ";
    lVar9 = 2;
    goto LAB_0033e136;
  }
  std::ostream::_M_insert<double>(dVar12);
  return;
}

Assistant:

void FBXExportProperty::DumpAscii(std::ostream& s, int indent) {
    // no writing type... or anything. just shove it into the stream.
    uint8_t* d = data.data();
    size_t N;
    size_t swap = data.size();
    size_t count = 0;
    switch (type) {
    case 'C':
        if (*(reinterpret_cast<uint8_t*>(d))) { s << 'T'; }
        else { s << 'F'; }
        return;
    case 'Y': s << *(reinterpret_cast<int16_t*>(d)); return;
    case 'I': s << *(reinterpret_cast<int32_t*>(d)); return;
    case 'F': s << *(reinterpret_cast<float*>(d)); return;
    case 'D': s << *(reinterpret_cast<double*>(d)); return;
    case 'L': s << *(reinterpret_cast<int64_t*>(d)); return;
    case 'S':
        // first search to see if it has "\x00\x01" in it -
        // which separates fields which are reversed in the ascii version.
        // yeah.
        // FBX, yeah.
        for (size_t i = 0; i < data.size(); ++i) {
            if (data[i] == '\0') {
                swap = i;
                break;
            }
        }
    case 'R':
        s << '"';
        // we might as well check this now,
        // probably it will never happen
        for (size_t i = 0; i < data.size(); ++i) {
            char c = data[i];
            if (c == '"') {
                throw runtime_error("can't handle quotes in property string");
            }
        }
        // first write the SWAPPED member (if any)
        for (size_t i = swap + 2; i < data.size(); ++i) {
            char c = data[i];
            s << c;
        }
        // then a separator
        if (swap != data.size()) {
            s << "::";
        }
        // then the initial member
        for (size_t i = 0; i < swap; ++i) {
            char c = data[i];
            s << c;
        }
        s << '"';
        return;
    case 'i':
        N = data.size() / 4; // number of elements
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<int32_t*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'l':
        N = data.size() / 8;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<int64_t*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'f':
        N = data.size() / 4;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<float*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'd':
        N = data.size() / 8;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        // set precision to something that can handle doubles
        s.precision(15);
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<double*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    default:
        std::ostringstream err;
        err << "Tried to dump property with invalid type '";
        err << type << "'!";
        throw runtime_error(err.str());
    }
}